

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx2_popcnt(uint16_t *data,uint32_t len,uint32_t *flags)

{
  long lVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 (*pauVar58) [32];
  long lVar59;
  ulong uVar60;
  long lVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  __m256i stubs [16];
  __m256i masks [16];
  uint32_t out_counters [16];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_100 [3] [64];
  
  auVar105 = ZEXT1664((undefined1  [16])0x0);
  local_500 = vmovdqa64_avx512f(auVar105);
  local_540 = vmovdqa64_avx512f(auVar105);
  local_580 = vmovdqa64_avx512f(auVar105);
  local_5c0 = vmovdqa64_avx512f(auVar105);
  local_600 = vmovdqa64_avx512f(auVar105);
  local_640 = vmovdqa64_avx512f(auVar105);
  local_680 = vmovdqa64_avx512f(auVar105);
  local_6c0 = vmovdqa64_avx512f(auVar105);
  pauVar58 = &local_420;
  lVar59 = 0;
  do {
    auVar62 = vpbroadcastw_avx512vl();
    *pauVar58 = auVar62;
    lVar59 = lVar59 + 1;
    pauVar58 = pauVar58 + 1;
  } while (lVar59 != 0x10);
  local_100[0] = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  uVar60 = 0;
  if (0xff < len) {
    lVar59 = 0;
    uVar60 = 0;
    do {
      auVar62 = *(undefined1 (*) [32])(data + lVar59 * 0x10);
      auVar63 = vmovdqa64_avx512vl(local_3c0);
      auVar64 = vpternlogq_avx512vl(local_6c0._0_32_,local_420,auVar62,0xf8);
      auVar65 = vmovdqa64_avx512vl(local_420);
      auVar120 = vpand_avx2(local_400,auVar62);
      auVar120 = vpsrlw_avx2(auVar120,1);
      auVar93 = vpor_avx2(auVar120,local_6c0._32_32_);
      auVar120 = vpand_avx2(local_3e0,auVar62);
      auVar120 = vpsrlw_avx2(auVar120,2);
      auVar122 = vpor_avx2(auVar120,local_680._0_32_);
      auVar120 = vpandq_avx512vl(auVar63,auVar62);
      auVar120 = vpsrlw_avx2(auVar120,3);
      auVar86 = vpor_avx2(auVar120,local_680._32_32_);
      auVar66 = vmovdqa64_avx512vl(local_3a0);
      auVar120 = vpandq_avx512vl(auVar66,auVar62);
      auVar120 = vpsrlw_avx2(auVar120,4);
      auVar67 = vporq_avx512vl(auVar120,local_640._0_32_);
      vmovdqa64_avx512vl(auVar67);
      auVar68 = vmovdqa64_avx512vl(local_380);
      auVar120 = vpandq_avx512vl(auVar68,auVar62);
      auVar120 = vpsrlw_avx2(auVar120,5);
      auVar87 = vpor_avx2(auVar120,local_640._32_32_);
      auVar120 = vpand_avx2(local_360,auVar62);
      auVar69 = vmovdqa64_avx512vl(local_360);
      auVar120 = vpsrlw_avx2(auVar120,6);
      auVar88 = vpor_avx2(auVar120,local_600._0_32_);
      auVar120 = vpand_avx2(local_340,auVar62);
      auVar120 = vpsrlw_avx2(auVar120,7);
      auVar89 = vpor_avx2(auVar120,local_600._32_32_);
      auVar70 = vmovdqa64_avx512vl(local_320);
      auVar120 = vpandq_avx512vl(auVar70,auVar62);
      auVar120 = vpsrlw_avx2(auVar120,8);
      auVar90 = vpor_avx2(auVar120,local_5c0._0_32_);
      auVar71 = vmovdqa64_avx512vl(local_300);
      auVar120 = vpandq_avx512vl(auVar71,auVar62);
      auVar120 = vpsrlw_avx2(auVar120,9);
      auVar91 = vpor_avx2(auVar120,local_5c0._32_32_);
      auVar120 = vpand_avx2(local_2e0,auVar62);
      auVar120 = vpsrlw_avx2(auVar120,10);
      auVar72 = vporq_avx512vl(auVar120,local_580._0_32_);
      vmovdqa64_avx512vl(auVar72);
      auVar73 = vmovdqa64_avx512vl(local_2c0);
      auVar74 = vpandq_avx512vl(auVar73,auVar62);
      auVar120 = vmovdqa64_avx512vl(auVar73);
      auVar74 = vpsrlw_avx2(auVar74,0xb);
      auVar75 = vporq_avx512vl(auVar74,local_580._32_32_);
      vmovdqa64_avx512vl(auVar75);
      auVar74 = vpand_avx2(local_2a0,auVar62);
      auVar74 = vpsrlw_avx2(auVar74,0xc);
      auVar76 = vporq_avx512vl(auVar74,local_540._0_32_);
      vmovdqa64_avx512vl(auVar76);
      auVar77 = vmovdqa64_avx512vl(local_280);
      auVar74 = vpandq_avx512vl(auVar77,auVar62);
      auVar74 = vpsrlw_avx2(auVar74,0xd);
      auVar78 = vporq_avx512vl(auVar74,local_540._32_32_);
      vmovdqa64_avx512vl(auVar78);
      auVar74 = vpand_avx2(local_260,auVar62);
      auVar74 = vpsrlw_avx2(auVar74,0xe);
      auVar79 = vporq_avx512vl(auVar74,local_500._0_32_);
      vmovdqa64_avx512vl(auVar79);
      auVar62 = vpand_avx2(local_240,auVar62);
      auVar62 = vpsrlw_avx2(auVar62,0xf);
      auVar98 = vpor_avx2(auVar62,local_500._32_32_);
      auVar80 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0x10));
      auVar62 = vpandq_avx512vl(auVar80,auVar65);
      auVar62 = vpaddw_avx2(auVar62,auVar62);
      auVar81 = vporq_avx512vl(auVar64,auVar62);
      auVar74 = vpandq_avx512vl(local_400,auVar80);
      auVar62._8_8_ = 0xfffefffefffefffe;
      auVar62._0_8_ = 0xfffefffefffefffe;
      auVar62._16_8_ = 0xfffefffefffefffe;
      auVar62._24_8_ = 0xfffefffefffefffe;
      auVar82 = vpternlogq_avx512vl(auVar74,auVar93,auVar62,0xec);
      auVar62 = vpandq_avx512vl(auVar80,local_3e0);
      auVar62 = vpsrlw_avx2(auVar62,1);
      auVar74._8_8_ = 0x7ffe7ffe7ffe7ffe;
      auVar74._0_8_ = 0x7ffe7ffe7ffe7ffe;
      auVar74._16_8_ = 0x7ffe7ffe7ffe7ffe;
      auVar74._24_8_ = 0x7ffe7ffe7ffe7ffe;
      auVar83 = vpternlogq_avx512vl(auVar62,auVar122,auVar74,0xec);
      auVar62 = vpandq_avx512vl(auVar80,auVar63);
      auVar62 = vpsrlw_avx2(auVar62,2);
      auVar93._8_8_ = 0x3ffe3ffe3ffe3ffe;
      auVar93._0_8_ = 0x3ffe3ffe3ffe3ffe;
      auVar93._16_8_ = 0x3ffe3ffe3ffe3ffe;
      auVar93._24_8_ = 0x3ffe3ffe3ffe3ffe;
      auVar84 = vpternlogq_avx512vl(auVar62,auVar86,auVar93,0xec);
      auVar62 = vpandq_avx512vl(auVar80,auVar66);
      auVar62 = vpsrlw_avx2(auVar62,3);
      auVar122._8_8_ = 0x1ffe1ffe1ffe1ffe;
      auVar122._0_8_ = 0x1ffe1ffe1ffe1ffe;
      auVar122._16_8_ = 0x1ffe1ffe1ffe1ffe;
      auVar122._24_8_ = 0x1ffe1ffe1ffe1ffe;
      auVar85 = vpternlogq_avx512vl(auVar62,auVar67,auVar122,0xec);
      auVar62 = vpandq_avx512vl(auVar80,auVar68);
      auVar62 = vpsrlw_avx2(auVar62,4);
      auVar86._8_8_ = 0xffe0ffe0ffe0ffe;
      auVar86._0_8_ = 0xffe0ffe0ffe0ffe;
      auVar86._16_8_ = 0xffe0ffe0ffe0ffe;
      auVar86._24_8_ = 0xffe0ffe0ffe0ffe;
      auVar86 = vpternlogq_avx512vl(auVar62,auVar87,auVar86,0xec);
      auVar74 = vpandq_avx512vl(auVar80,auVar69);
      auVar62 = vmovdqa64_avx512vl(auVar69);
      auVar74 = vpsrlw_avx2(auVar74,5);
      auVar87._8_8_ = 0x7fe07fe07fe07fe;
      auVar87._0_8_ = 0x7fe07fe07fe07fe;
      auVar87._16_8_ = 0x7fe07fe07fe07fe;
      auVar87._24_8_ = 0x7fe07fe07fe07fe;
      auVar87 = vpternlogq_avx512vl(auVar74,auVar88,auVar87,0xec);
      auVar74 = vpandq_avx512vl(auVar80,local_340);
      auVar74 = vpsrlw_avx2(auVar74,6);
      auVar88._8_8_ = 0x3fe03fe03fe03fe;
      auVar88._0_8_ = 0x3fe03fe03fe03fe;
      auVar88._16_8_ = 0x3fe03fe03fe03fe;
      auVar88._24_8_ = 0x3fe03fe03fe03fe;
      auVar88 = vpternlogq_avx512vl(auVar74,auVar89,auVar88,0xec);
      auVar74 = vpandq_avx512vl(auVar80,auVar70);
      auVar74 = vpsrlw_avx2(auVar74,7);
      auVar89._8_8_ = 0x1fe01fe01fe01fe;
      auVar89._0_8_ = 0x1fe01fe01fe01fe;
      auVar89._16_8_ = 0x1fe01fe01fe01fe;
      auVar89._24_8_ = 0x1fe01fe01fe01fe;
      auVar89 = vpternlogq_avx512vl(auVar74,auVar90,auVar89,0xec);
      auVar74 = vpandq_avx512vl(auVar80,auVar71);
      auVar74 = vpsrlw_avx2(auVar74,8);
      auVar90._8_8_ = 0xfe00fe00fe00fe;
      auVar90._0_8_ = 0xfe00fe00fe00fe;
      auVar90._16_8_ = 0xfe00fe00fe00fe;
      auVar90._24_8_ = 0xfe00fe00fe00fe;
      auVar90 = vpternlogq_avx512vl(auVar74,auVar91,auVar90,0xec);
      auVar74 = vpandq_avx512vl(auVar80,local_2e0);
      auVar74 = vpsrlw_avx2(auVar74,9);
      auVar91._8_8_ = 0x7e007e007e007e;
      auVar91._0_8_ = 0x7e007e007e007e;
      auVar91._16_8_ = 0x7e007e007e007e;
      auVar91._24_8_ = 0x7e007e007e007e;
      auVar91 = vpternlogq_avx512vl(auVar74,auVar72,auVar91,0xec);
      auVar74 = vpandq_avx512vl(auVar80,auVar73);
      auVar74 = vpsrlw_avx512vl(auVar74,10);
      auVar64._8_8_ = 0x3e003e003e003e;
      auVar64._0_8_ = 0x3e003e003e003e;
      auVar64._16_8_ = 0x3e003e003e003e;
      auVar64._24_8_ = 0x3e003e003e003e;
      auVar64 = vpternlogq_avx512vl(auVar74,auVar75,auVar64,0xec);
      auVar92 = vmovdqa64_avx512vl(local_2a0);
      auVar74 = vpandq_avx512vl(auVar80,auVar92);
      auVar74 = vpsrlw_avx512vl(auVar74,0xb);
      auVar65._8_8_ = 0x1e001e001e001e;
      auVar65._0_8_ = 0x1e001e001e001e;
      auVar65._16_8_ = 0x1e001e001e001e;
      auVar65._24_8_ = 0x1e001e001e001e;
      auVar65 = vpternlogq_avx512vl(auVar74,auVar76,auVar65,0xec);
      auVar74 = vmovdqa64_avx512vl(auVar77);
      auVar93 = vpandq_avx512vl(auVar80,auVar77);
      auVar93 = vpsrlw_avx512vl(auVar93,0xc);
      auVar67._8_8_ = 0xe000e000e000e;
      auVar67._0_8_ = 0xe000e000e000e;
      auVar67._16_8_ = 0xe000e000e000e;
      auVar67._24_8_ = 0xe000e000e000e;
      auVar67 = vpternlogq_avx512vl(auVar93,auVar78,auVar67,0xec);
      auVar93 = vpandq_avx512vl(auVar80,local_260);
      auVar93 = vpsrlw_avx512vl(auVar93,0xd);
      auVar72._8_8_ = 0x6000600060006;
      auVar72._0_8_ = 0x6000600060006;
      auVar72._16_8_ = 0x6000600060006;
      auVar72._24_8_ = 0x6000600060006;
      auVar72 = vpternlogq_avx512vl(auVar93,auVar79,auVar72,0xec);
      auVar93 = vpandq_avx512vl(auVar80,local_240);
      auVar93 = vpsrlw_avx512vl(auVar93,0xe);
      auVar73._8_8_ = 0x2000200020002;
      auVar73._0_8_ = 0x2000200020002;
      auVar73._16_8_ = 0x2000200020002;
      auVar73._24_8_ = 0x2000200020002;
      auVar73 = vpternlogq_avx512vl(auVar93,auVar98,auVar73,0xec);
      vmovdqa64_avx512vl(auVar81);
      vmovdqa64_avx512vl(auVar64);
      vmovdqa64_avx512vl(auVar65);
      vmovdqa64_avx512vl(auVar67);
      vmovdqa64_avx512vl(auVar72);
      vmovdqa64_avx512vl(auVar73);
      auVar93 = *(undefined1 (*) [32])(data + lVar59 * 0x10 + 0x20);
      auVar122 = vpand_avx2(local_420,auVar93);
      auVar122 = vpsllw_avx2(auVar122,2);
      auVar94 = vporq_avx512vl(auVar81,auVar122);
      auVar95 = vmovdqa64_avx512vl(local_400);
      auVar122 = vpandq_avx512vl(auVar93,auVar95);
      auVar122 = vpaddw_avx512vl(auVar122,auVar122);
      auVar123._8_8_ = 0xfffcfffcfffcfffc;
      auVar123._0_8_ = 0xfffcfffcfffcfffc;
      auVar123._16_8_ = 0xfffcfffcfffcfffc;
      auVar123._24_8_ = 0xfffcfffcfffcfffc;
      auVar96 = vpternlogq_avx512vl(auVar122,auVar82,auVar123,0xec);
      auVar97 = vmovdqa64_avx512vl(local_3e0);
      auVar122 = vpandq_avx512vl(auVar97,auVar93);
      auVar83 = vpternlogq_avx512vl(auVar122,auVar83,auVar123,0xec);
      auVar98 = vpandq_avx512vl(auVar93,auVar63);
      auVar122 = vmovdqa64_avx512vl(auVar63);
      auVar75 = vpsrlw_avx2(auVar98,1);
      auVar98._8_8_ = 0x7ffc7ffc7ffc7ffc;
      auVar98._0_8_ = 0x7ffc7ffc7ffc7ffc;
      auVar98._16_8_ = 0x7ffc7ffc7ffc7ffc;
      auVar98._24_8_ = 0x7ffc7ffc7ffc7ffc;
      auVar98 = vpternlogq_avx512vl(auVar75,auVar84,auVar98,0xec);
      auVar75 = vpandq_avx512vl(auVar93,auVar66);
      auVar76 = vpsrlw_avx2(auVar75,2);
      auVar75._8_8_ = 0x3ffc3ffc3ffc3ffc;
      auVar75._0_8_ = 0x3ffc3ffc3ffc3ffc;
      auVar75._16_8_ = 0x3ffc3ffc3ffc3ffc;
      auVar75._24_8_ = 0x3ffc3ffc3ffc3ffc;
      auVar75 = vpternlogq_avx512vl(auVar76,auVar85,auVar75,0xec);
      auVar76 = vpandq_avx512vl(auVar93,auVar68);
      auVar99 = vmovdqa64_avx512vl(auVar68);
      auVar76 = vpsrlw_avx2(auVar76,3);
      auVar68._8_8_ = 0x1ffc1ffc1ffc1ffc;
      auVar68._0_8_ = 0x1ffc1ffc1ffc1ffc;
      auVar68._16_8_ = 0x1ffc1ffc1ffc1ffc;
      auVar68._24_8_ = 0x1ffc1ffc1ffc1ffc;
      auVar68 = vpternlogq_avx512vl(auVar76,auVar86,auVar68,0xec);
      auVar86 = vpandq_avx512vl(auVar93,auVar69);
      auVar86 = vpsrlw_avx2(auVar86,4);
      auVar69._8_8_ = 0xffc0ffc0ffc0ffc;
      auVar69._0_8_ = 0xffc0ffc0ffc0ffc;
      auVar69._16_8_ = 0xffc0ffc0ffc0ffc;
      auVar69._24_8_ = 0xffc0ffc0ffc0ffc;
      auVar69 = vpternlogq_avx512vl(auVar86,auVar87,auVar69,0xec);
      auVar86 = vpand_avx2(local_340,auVar93);
      auVar86 = vpsrlw_avx2(auVar86,5);
      auVar76._8_8_ = 0x7fc07fc07fc07fc;
      auVar76._0_8_ = 0x7fc07fc07fc07fc;
      auVar76._16_8_ = 0x7fc07fc07fc07fc;
      auVar76._24_8_ = 0x7fc07fc07fc07fc;
      auVar76 = vpternlogq_avx512vl(auVar86,auVar88,auVar76,0xec);
      auVar85 = vmovdqa64_avx512vl(auVar70);
      auVar86 = vmovdqa64_avx512vl(auVar70);
      auVar87 = vpandq_avx512vl(auVar93,auVar70);
      auVar87 = vpsrlw_avx2(auVar87,6);
      auVar70._8_8_ = 0x3fc03fc03fc03fc;
      auVar70._0_8_ = 0x3fc03fc03fc03fc;
      auVar70._16_8_ = 0x3fc03fc03fc03fc;
      auVar70._24_8_ = 0x3fc03fc03fc03fc;
      auVar89 = vpternlogq_avx512vl(auVar87,auVar89,auVar70,0xec);
      auVar70 = vmovdqa64_avx512vl(auVar71);
      auVar87 = vpandq_avx512vl(auVar93,auVar71);
      auVar87 = vpsrlw_avx2(auVar87,7);
      auVar71._8_8_ = 0x1fc01fc01fc01fc;
      auVar71._0_8_ = 0x1fc01fc01fc01fc;
      auVar71._16_8_ = 0x1fc01fc01fc01fc;
      auVar71._24_8_ = 0x1fc01fc01fc01fc;
      auVar90 = vpternlogq_avx512vl(auVar87,auVar90,auVar71,0xec);
      auVar71 = vmovdqa64_avx512vl(local_2e0);
      auVar87 = vpandq_avx512vl(auVar93,auVar71);
      auVar87 = vpsrlw_avx2(auVar87,8);
      auVar78._8_8_ = 0xfc00fc00fc00fc;
      auVar78._0_8_ = 0xfc00fc00fc00fc;
      auVar78._16_8_ = 0xfc00fc00fc00fc;
      auVar78._24_8_ = 0xfc00fc00fc00fc;
      auVar91 = vpternlogq_avx512vl(auVar87,auVar91,auVar78,0xec);
      auVar78 = vmovdqa64_avx512vl(auVar120);
      auVar87 = vpandq_avx512vl(auVar93,auVar78);
      auVar87 = vpsrlw_avx2(auVar87,9);
      auVar79._8_8_ = 0x7c007c007c007c;
      auVar79._0_8_ = 0x7c007c007c007c;
      auVar79._16_8_ = 0x7c007c007c007c;
      auVar79._24_8_ = 0x7c007c007c007c;
      auVar64 = vpternlogq_avx512vl(auVar87,auVar64,auVar79,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar92);
      auVar87 = vpsrlw_avx512vl(auVar87,10);
      auVar80._8_8_ = 0x3c003c003c003c;
      auVar80._0_8_ = 0x3c003c003c003c;
      auVar80._16_8_ = 0x3c003c003c003c;
      auVar80._24_8_ = 0x3c003c003c003c;
      auVar65 = vpternlogq_avx512vl(auVar87,auVar65,auVar80,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar77);
      auVar87 = vpsrlw_avx512vl(auVar87,0xb);
      auVar77._8_8_ = 0x1c001c001c001c;
      auVar77._0_8_ = 0x1c001c001c001c;
      auVar77._16_8_ = 0x1c001c001c001c;
      auVar77._24_8_ = 0x1c001c001c001c;
      auVar67 = vpternlogq_avx512vl(auVar87,auVar67,auVar77,0xec);
      auVar87 = vpand_avx2(auVar93,local_260);
      auVar87 = vpsrlw_avx512vl(auVar87,0xc);
      auVar81._8_8_ = 0xc000c000c000c;
      auVar81._0_8_ = 0xc000c000c000c;
      auVar81._16_8_ = 0xc000c000c000c;
      auVar81._24_8_ = 0xc000c000c000c;
      auVar72 = vpternlogq_avx512vl(auVar87,auVar72,auVar81,0xec);
      auVar79 = vmovdqa64_avx512vl(local_240);
      auVar93 = vpandq_avx512vl(auVar93,auVar79);
      auVar93 = vpsrlw_avx512vl(auVar93,0xd);
      auVar82._8_8_ = 0x4000400040004;
      auVar82._0_8_ = 0x4000400040004;
      auVar82._16_8_ = 0x4000400040004;
      auVar82._24_8_ = 0x4000400040004;
      auVar73 = vpternlogq_avx512vl(auVar93,auVar73,auVar82,0xec);
      vmovdqa64_avx512vl(auVar96);
      vmovdqa64_avx512vl(auVar65);
      vmovdqa64_avx512vl(auVar67);
      vmovdqa64_avx512vl(auVar72);
      vmovdqa64_avx512vl(auVar73);
      auVar93 = *(undefined1 (*) [32])(data + lVar59 * 0x10 + 0x30);
      auVar87 = vpand_avx2(local_420,auVar93);
      auVar87 = vpsllw_avx2(auVar87,3);
      auVar88 = vpor_avx2(auVar87,auVar94);
      auVar87 = vpandq_avx512vl(auVar93,auVar95);
      auVar87 = vpsllw_avx512vl(auVar87,2);
      auVar103._8_8_ = 0xfff8fff8fff8fff8;
      auVar103._0_8_ = 0xfff8fff8fff8fff8;
      auVar103._16_8_ = 0xfff8fff8fff8fff8;
      auVar103._24_8_ = 0xfff8fff8fff8fff8;
      auVar80 = vpternlogq_avx512vl(auVar87,auVar96,auVar103,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar97);
      auVar87 = vpaddw_avx512vl(auVar87,auVar87);
      auVar77 = vpternlogq_avx512vl(auVar87,auVar83,auVar103,0xec);
      auVar87 = vpandq_avx512vl(auVar63,auVar93);
      auVar98 = vpternlogq_avx512vl(auVar87,auVar98,auVar103,0xec);
      auVar81 = vmovdqa64_avx512vl(auVar66);
      auVar87 = vpandq_avx512vl(auVar93,auVar66);
      auVar87 = vpsrlw_avx2(auVar87,1);
      auVar63._8_8_ = 0x7ff87ff87ff87ff8;
      auVar63._0_8_ = 0x7ff87ff87ff87ff8;
      auVar63._16_8_ = 0x7ff87ff87ff87ff8;
      auVar63._24_8_ = 0x7ff87ff87ff87ff8;
      auVar75 = vpternlogq_avx512vl(auVar87,auVar75,auVar63,0xec);
      auVar87 = vpand_avx2(auVar99,auVar93);
      auVar87 = vpsrlw_avx2(auVar87,2);
      auVar66._8_8_ = 0x3ff83ff83ff83ff8;
      auVar66._0_8_ = 0x3ff83ff83ff83ff8;
      auVar66._16_8_ = 0x3ff83ff83ff83ff8;
      auVar66._24_8_ = 0x3ff83ff83ff83ff8;
      auVar68 = vpternlogq_avx512vl(auVar87,auVar68,auVar66,0xec);
      auVar82 = vmovdqa64_avx512vl(auVar62);
      auVar62 = vpandq_avx512vl(auVar93,auVar82);
      auVar62 = vpsrlw_avx2(auVar62,3);
      auVar83._8_8_ = 0x1ff81ff81ff81ff8;
      auVar83._0_8_ = 0x1ff81ff81ff81ff8;
      auVar83._16_8_ = 0x1ff81ff81ff81ff8;
      auVar83._24_8_ = 0x1ff81ff81ff81ff8;
      auVar69 = vpternlogq_avx512vl(auVar62,auVar69,auVar83,0xec);
      auVar62 = vpand_avx2(local_340,auVar93);
      auVar62 = vpsrlw_avx2(auVar62,4);
      auVar84._8_8_ = 0xff80ff80ff80ff8;
      auVar84._0_8_ = 0xff80ff80ff80ff8;
      auVar84._16_8_ = 0xff80ff80ff80ff8;
      auVar84._24_8_ = 0xff80ff80ff80ff8;
      auVar76 = vpternlogq_avx512vl(auVar62,auVar76,auVar84,0xec);
      auVar62 = vpandq_avx512vl(auVar93,auVar85);
      auVar62 = vpsrlw_avx2(auVar62,5);
      auVar85._8_8_ = 0x7f807f807f807f8;
      auVar85._0_8_ = 0x7f807f807f807f8;
      auVar85._16_8_ = 0x7f807f807f807f8;
      auVar85._24_8_ = 0x7f807f807f807f8;
      auVar89 = vpternlogq_avx512vl(auVar62,auVar89,auVar85,0xec);
      auVar63 = vmovdqa64_avx512vl(auVar70);
      auVar62 = vmovdqa64_avx512vl(auVar70);
      auVar87 = vpandq_avx512vl(auVar93,auVar70);
      auVar87 = vpsrlw_avx2(auVar87,6);
      auVar92._8_8_ = 0x3f803f803f803f8;
      auVar92._0_8_ = 0x3f803f803f803f8;
      auVar92._16_8_ = 0x3f803f803f803f8;
      auVar92._24_8_ = 0x3f803f803f803f8;
      auVar90 = vpternlogq_avx512vl(auVar87,auVar90,auVar92,0xec);
      auVar70 = vmovdqa64_avx512vl(auVar71);
      auVar87 = vpandq_avx512vl(auVar93,auVar71);
      auVar87 = vpsrlw_avx2(auVar87,7);
      auVar94._8_8_ = 0x1f801f801f801f8;
      auVar94._0_8_ = 0x1f801f801f801f8;
      auVar94._16_8_ = 0x1f801f801f801f8;
      auVar94._24_8_ = 0x1f801f801f801f8;
      auVar91 = vpternlogq_avx512vl(auVar87,auVar91,auVar94,0xec);
      auVar71 = vmovdqa64_avx512vl(auVar78);
      auVar87 = vpandq_avx512vl(auVar93,auVar78);
      auVar87 = vpsrlw_avx2(auVar87,8);
      auVar95._8_8_ = 0xf800f800f800f8;
      auVar95._0_8_ = 0xf800f800f800f8;
      auVar95._16_8_ = 0xf800f800f800f8;
      auVar95._24_8_ = 0xf800f800f800f8;
      auVar64 = vpternlogq_avx512vl(auVar87,auVar64,auVar95,0xec);
      auVar78 = vmovdqa64_avx512vl(local_2a0);
      auVar87 = vpandq_avx512vl(auVar93,auVar78);
      auVar87 = vpsrlw_avx2(auVar87,9);
      auVar96._8_8_ = 0x78007800780078;
      auVar96._0_8_ = 0x78007800780078;
      auVar96._16_8_ = 0x78007800780078;
      auVar96._24_8_ = 0x78007800780078;
      auVar65 = vpternlogq_avx512vl(auVar87,auVar65,auVar96,0xec);
      auVar66 = vmovdqa64_avx512vl(auVar74);
      auVar87 = vpandq_avx512vl(auVar93,auVar66);
      auVar87 = vpsrlw_avx512vl(auVar87,10);
      auVar2._8_8_ = 0x38003800380038;
      auVar2._0_8_ = 0x38003800380038;
      auVar2._16_8_ = 0x38003800380038;
      auVar2._24_8_ = 0x38003800380038;
      auVar67 = vpternlogq_avx512vl(auVar87,auVar67,auVar2,0xec);
      auVar83 = vmovdqa64_avx512vl(local_260);
      auVar87 = vpandq_avx512vl(auVar93,auVar83);
      auVar87 = vpsrlw_avx512vl(auVar87,0xb);
      auVar3._8_8_ = 0x18001800180018;
      auVar3._0_8_ = 0x18001800180018;
      auVar3._16_8_ = 0x18001800180018;
      auVar3._24_8_ = 0x18001800180018;
      auVar72 = vpternlogq_avx512vl(auVar87,auVar72,auVar3,0xec);
      auVar93 = vpandq_avx512vl(auVar93,auVar79);
      auVar93 = vpsrlw_avx512vl(auVar93,0xc);
      auVar4._8_8_ = 0x8000800080008;
      auVar4._0_8_ = 0x8000800080008;
      auVar4._16_8_ = 0x8000800080008;
      auVar4._24_8_ = 0x8000800080008;
      auVar73 = vpternlogq_avx512vl(auVar93,auVar73,auVar4,0xec);
      vmovdqa64_avx512vl(auVar80);
      vmovdqa64_avx512vl(auVar77);
      vmovdqa64_avx512vl(auVar67);
      vmovdqa64_avx512vl(auVar72);
      vmovdqa64_avx512vl(auVar73);
      auVar93 = *(undefined1 (*) [32])(data + lVar59 * 0x10 + 0x40);
      auVar87 = vpand_avx2(auVar93,local_420);
      auVar87 = vpsllw_avx2(auVar87,4);
      auVar88 = vpor_avx2(auVar88,auVar87);
      auVar87 = vpand_avx2(auVar93,local_400);
      auVar87 = vpsllw_avx512vl(auVar87,3);
      auVar124._8_8_ = 0xfff0fff0fff0fff0;
      auVar124._0_8_ = 0xfff0fff0fff0fff0;
      auVar124._16_8_ = 0xfff0fff0fff0fff0;
      auVar124._24_8_ = 0xfff0fff0fff0fff0;
      auVar80 = vpternlogq_avx512vl(auVar87,auVar80,auVar124,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar97);
      auVar87 = vpsllw_avx512vl(auVar87,2);
      auVar77 = vpternlogq_avx512vl(auVar87,auVar77,auVar124,0xec);
      auVar84 = vmovdqa64_avx512vl(auVar122);
      auVar87 = vpandq_avx512vl(auVar93,auVar84);
      auVar87 = vpaddw_avx512vl(auVar87,auVar87);
      auVar98 = vpternlogq_avx512vl(auVar87,auVar98,auVar124,0xec);
      auVar87 = vpand_avx2(auVar81,auVar93);
      auVar75 = vpternlogq_avx512vl(auVar87,auVar75,auVar124,0xec);
      auVar87 = vpand_avx2(auVar99,auVar93);
      auVar87 = vpsrlw_avx2(auVar87,1);
      auVar97._8_8_ = 0x7ff07ff07ff07ff0;
      auVar97._0_8_ = 0x7ff07ff07ff07ff0;
      auVar97._16_8_ = 0x7ff07ff07ff07ff0;
      auVar97._24_8_ = 0x7ff07ff07ff07ff0;
      auVar68 = vpternlogq_avx512vl(auVar87,auVar68,auVar97,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar82);
      auVar87 = vpsrlw_avx2(auVar87,2);
      auVar5._8_8_ = 0x3ff03ff03ff03ff0;
      auVar5._0_8_ = 0x3ff03ff03ff03ff0;
      auVar5._16_8_ = 0x3ff03ff03ff03ff0;
      auVar5._24_8_ = 0x3ff03ff03ff03ff0;
      auVar69 = vpternlogq_avx512vl(auVar87,auVar69,auVar5,0xec);
      auVar85 = vmovdqa64_avx512vl(local_340);
      auVar87 = vpand_avx2(auVar93,local_340);
      auVar87 = vpsrlw_avx2(auVar87,3);
      auVar6._8_8_ = 0x1ff01ff01ff01ff0;
      auVar6._0_8_ = 0x1ff01ff01ff01ff0;
      auVar6._16_8_ = 0x1ff01ff01ff01ff0;
      auVar6._24_8_ = 0x1ff01ff01ff01ff0;
      auVar76 = vpternlogq_avx512vl(auVar87,auVar76,auVar6,0xec);
      auVar87 = vpand_avx2(auVar93,auVar86);
      auVar87 = vpsrlw_avx2(auVar87,4);
      auVar7._8_8_ = 0xff00ff00ff00ff0;
      auVar7._0_8_ = 0xff00ff00ff00ff0;
      auVar7._16_8_ = 0xff00ff00ff00ff0;
      auVar7._24_8_ = 0xff00ff00ff00ff0;
      auVar89 = vpternlogq_avx512vl(auVar87,auVar89,auVar7,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar63);
      auVar87 = vpsrlw_avx2(auVar87,5);
      auVar8._8_8_ = 0x7f007f007f007f0;
      auVar8._0_8_ = 0x7f007f007f007f0;
      auVar8._16_8_ = 0x7f007f007f007f0;
      auVar8._24_8_ = 0x7f007f007f007f0;
      auVar90 = vpternlogq_avx512vl(auVar87,auVar90,auVar8,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar70);
      auVar87 = vpsrlw_avx2(auVar87,6);
      auVar9._8_8_ = 0x3f003f003f003f0;
      auVar9._0_8_ = 0x3f003f003f003f0;
      auVar9._16_8_ = 0x3f003f003f003f0;
      auVar9._24_8_ = 0x3f003f003f003f0;
      auVar91 = vpternlogq_avx512vl(auVar87,auVar91,auVar9,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar71);
      auVar87 = vpsrlw_avx2(auVar87,7);
      auVar10._8_8_ = 0x1f001f001f001f0;
      auVar10._0_8_ = 0x1f001f001f001f0;
      auVar10._16_8_ = 0x1f001f001f001f0;
      auVar10._24_8_ = 0x1f001f001f001f0;
      auVar64 = vpternlogq_avx512vl(auVar87,auVar64,auVar10,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar78);
      auVar87 = vpsrlw_avx2(auVar87,8);
      auVar11._8_8_ = 0xf000f000f000f0;
      auVar11._0_8_ = 0xf000f000f000f0;
      auVar11._16_8_ = 0xf000f000f000f0;
      auVar11._24_8_ = 0xf000f000f000f0;
      auVar65 = vpternlogq_avx512vl(auVar87,auVar65,auVar11,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar66);
      auVar87 = vpsrlw_avx2(auVar87,9);
      auVar12._8_8_ = 0x70007000700070;
      auVar12._0_8_ = 0x70007000700070;
      auVar12._16_8_ = 0x70007000700070;
      auVar12._24_8_ = 0x70007000700070;
      auVar67 = vpternlogq_avx512vl(auVar87,auVar67,auVar12,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar83);
      auVar87 = vpsrlw_avx512vl(auVar87,10);
      auVar13._8_8_ = 0x30003000300030;
      auVar13._0_8_ = 0x30003000300030;
      auVar13._16_8_ = 0x30003000300030;
      auVar13._24_8_ = 0x30003000300030;
      auVar72 = vpternlogq_avx512vl(auVar87,auVar72,auVar13,0xec);
      auVar93 = vpandq_avx512vl(auVar93,auVar79);
      auVar93 = vpsrlw_avx512vl(auVar93,0xb);
      auVar14._8_8_ = 0x10001000100010;
      auVar14._0_8_ = 0x10001000100010;
      auVar14._16_8_ = 0x10001000100010;
      auVar14._24_8_ = 0x10001000100010;
      auVar73 = vpternlogq_avx512vl(auVar93,auVar73,auVar14,0xec);
      vmovdqa64_avx512vl(auVar80);
      vmovdqa64_avx512vl(auVar77);
      vmovdqa64_avx512vl(auVar98);
      vmovdqa64_avx512vl(auVar72);
      vmovdqa64_avx512vl(auVar73);
      auVar93 = *(undefined1 (*) [32])(data + lVar59 * 0x10 + 0x50);
      auVar71 = vmovdqa64_avx512vl(local_420);
      auVar87 = vpandq_avx512vl(auVar93,auVar71);
      auVar87 = vpsllw_avx2(auVar87,5);
      auVar88 = vporq_avx512vl(auVar88,auVar87);
      auVar78 = vmovdqa64_avx512vl(local_400);
      auVar87 = vpandq_avx512vl(auVar93,auVar78);
      auVar87 = vpsllw_avx512vl(auVar87,4);
      auVar125._8_8_ = 0xffe0ffe0ffe0ffe0;
      auVar125._0_8_ = 0xffe0ffe0ffe0ffe0;
      auVar125._16_8_ = 0xffe0ffe0ffe0ffe0;
      auVar125._24_8_ = 0xffe0ffe0ffe0ffe0;
      auVar80 = vpternlogq_avx512vl(auVar87,auVar80,auVar125,0xec);
      auVar63 = vmovdqa64_avx512vl(local_3e0);
      auVar87 = vpandq_avx512vl(auVar93,auVar63);
      auVar87 = vpsllw_avx512vl(auVar87,3);
      auVar77 = vpternlogq_avx512vl(auVar87,auVar77,auVar125,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar84);
      auVar87 = vpsllw_avx512vl(auVar87,2);
      auVar98 = vpternlogq_avx512vl(auVar87,auVar98,auVar125,0xec);
      auVar87 = vpand_avx2(auVar81,auVar93);
      auVar87 = vpaddw_avx512vl(auVar87,auVar87);
      auVar75 = vpternlogq_avx512vl(auVar87,auVar75,auVar125,0xec);
      auVar87 = vpand_avx2(auVar99,auVar93);
      auVar68 = vpternlogq_avx512vl(auVar87,auVar68,auVar125,0xec);
      auVar66 = vmovdqa64_avx512vl(auVar82);
      auVar87 = vpandq_avx512vl(auVar93,auVar82);
      auVar87 = vpsrlw_avx2(auVar87,1);
      auVar15._8_8_ = 0x7fe07fe07fe07fe0;
      auVar15._0_8_ = 0x7fe07fe07fe07fe0;
      auVar15._16_8_ = 0x7fe07fe07fe07fe0;
      auVar15._24_8_ = 0x7fe07fe07fe07fe0;
      auVar69 = vpternlogq_avx512vl(auVar87,auVar69,auVar15,0xec);
      auVar87 = vpandq_avx512vl(auVar93,auVar85);
      auVar87 = vpsrlw_avx2(auVar87,2);
      auVar16._8_8_ = 0x3fe03fe03fe03fe0;
      auVar16._0_8_ = 0x3fe03fe03fe03fe0;
      auVar16._16_8_ = 0x3fe03fe03fe03fe0;
      auVar16._24_8_ = 0x3fe03fe03fe03fe0;
      auVar76 = vpternlogq_avx512vl(auVar87,auVar76,auVar16,0xec);
      auVar87 = vpand_avx2(auVar93,auVar86);
      auVar87 = vpsrlw_avx2(auVar87,3);
      auVar17._8_8_ = 0x1fe01fe01fe01fe0;
      auVar17._0_8_ = 0x1fe01fe01fe01fe0;
      auVar17._16_8_ = 0x1fe01fe01fe01fe0;
      auVar17._24_8_ = 0x1fe01fe01fe01fe0;
      auVar87 = vpternlogq_avx512vl(auVar87,auVar89,auVar17,0xec);
      auVar89 = vmovdqa64_avx512vl(auVar62);
      auVar62 = vpandq_avx512vl(auVar93,auVar89);
      auVar62 = vpsrlw_avx2(auVar62,4);
      auVar18._8_8_ = 0xfe00fe00fe00fe0;
      auVar18._0_8_ = 0xfe00fe00fe00fe0;
      auVar18._16_8_ = 0xfe00fe00fe00fe0;
      auVar18._24_8_ = 0xfe00fe00fe00fe0;
      auVar90 = vpternlogq_avx512vl(auVar62,auVar90,auVar18,0xec);
      auVar62 = vpandq_avx512vl(auVar93,auVar70);
      auVar62 = vpsrlw_avx2(auVar62,5);
      auVar19._8_8_ = 0x7e007e007e007e0;
      auVar19._0_8_ = 0x7e007e007e007e0;
      auVar19._16_8_ = 0x7e007e007e007e0;
      auVar19._24_8_ = 0x7e007e007e007e0;
      auVar91 = vpternlogq_avx512vl(auVar62,auVar91,auVar19,0xec);
      auVar82 = vmovdqa64_avx512vl(auVar120);
      auVar62 = vpandq_avx512vl(auVar93,auVar82);
      auVar62 = vpsrlw_avx2(auVar62,6);
      auVar120._8_8_ = 0x3e003e003e003e0;
      auVar120._0_8_ = 0x3e003e003e003e0;
      auVar120._16_8_ = 0x3e003e003e003e0;
      auVar120._24_8_ = 0x3e003e003e003e0;
      auVar64 = vpternlogq_avx512vl(auVar62,auVar64,auVar120,0xec);
      auVar83 = vmovdqa64_avx512vl(local_2a0);
      auVar62 = vpandq_avx512vl(auVar93,auVar83);
      auVar62 = vpsrlw_avx2(auVar62,7);
      auVar20._8_8_ = 0x1e001e001e001e0;
      auVar20._0_8_ = 0x1e001e001e001e0;
      auVar20._16_8_ = 0x1e001e001e001e0;
      auVar20._24_8_ = 0x1e001e001e001e0;
      auVar65 = vpternlogq_avx512vl(auVar62,auVar65,auVar20,0xec);
      auVar62 = vpand_avx2(auVar93,auVar74);
      auVar62 = vpsrlw_avx2(auVar62,8);
      auVar21._8_8_ = 0xe000e000e000e0;
      auVar21._0_8_ = 0xe000e000e000e0;
      auVar21._16_8_ = 0xe000e000e000e0;
      auVar21._24_8_ = 0xe000e000e000e0;
      auVar67 = vpternlogq_avx512vl(auVar62,auVar67,auVar21,0xec);
      auVar62 = vpand_avx2(auVar93,local_260);
      auVar62 = vpsrlw_avx2(auVar62,9);
      auVar22._8_8_ = 0x60006000600060;
      auVar22._0_8_ = 0x60006000600060;
      auVar22._16_8_ = 0x60006000600060;
      auVar22._24_8_ = 0x60006000600060;
      auVar72 = vpternlogq_avx512vl(auVar62,auVar72,auVar22,0xec);
      auVar62 = vpandq_avx512vl(auVar93,auVar79);
      auVar62 = vpsrlw_avx512vl(auVar62,10);
      auVar23._8_8_ = 0x20002000200020;
      auVar23._0_8_ = 0x20002000200020;
      auVar23._16_8_ = 0x20002000200020;
      auVar23._24_8_ = 0x20002000200020;
      auVar93 = vpternlogq_avx512vl(auVar62,auVar73,auVar23,0xec);
      vmovdqa64_avx512vl(auVar88);
      vmovdqa64_avx512vl(auVar80);
      vmovdqa64_avx512vl(auVar77);
      vmovdqa64_avx512vl(auVar98);
      vmovdqa64_avx512vl(auVar75);
      vmovdqa64_avx512vl(auVar93);
      auVar62 = *(undefined1 (*) [32])(data + lVar59 * 0x10 + 0x60);
      auVar120 = vpandq_avx512vl(auVar62,auVar71);
      auVar120 = vpsllw_avx2(auVar120,6);
      auVar88 = vporq_avx512vl(auVar88,auVar120);
      auVar120 = vpandq_avx512vl(auVar62,auVar78);
      auVar120 = vpsllw_avx512vl(auVar120,5);
      auVar129._8_8_ = 0xffc0ffc0ffc0ffc0;
      auVar129._0_8_ = 0xffc0ffc0ffc0ffc0;
      auVar129._16_8_ = 0xffc0ffc0ffc0ffc0;
      auVar129._24_8_ = 0xffc0ffc0ffc0ffc0;
      auVar73 = vpternlogq_avx512vl(auVar120,auVar80,auVar129,0xec);
      vmovdqa64_avx512vl(auVar73);
      auVar120 = vpandq_avx512vl(auVar62,auVar63);
      auVar120 = vpsllw_avx2(auVar120,4);
      auVar71 = vpternlogq_avx512vl(auVar120,auVar77,auVar129,0xec);
      auVar120 = vpand_avx2(auVar62,auVar122);
      auVar120 = vpsllw_avx2(auVar120,3);
      auVar122 = vpternlogq_avx512vl(auVar120,auVar98,auVar129,0xec);
      auVar120 = vpand_avx2(auVar62,auVar81);
      auVar120 = vpsllw_avx512vl(auVar120,2);
      auVar98 = vpternlogq_avx512vl(auVar120,auVar75,auVar129,0xec);
      vmovdqa64_avx512vl(auVar98);
      auVar120 = vpand_avx2(auVar62,auVar99);
      auVar120 = vpaddw_avx512vl(auVar120,auVar120);
      auVar75 = vpternlogq_avx512vl(auVar120,auVar68,auVar129,0xec);
      vmovdqa64_avx512vl(auVar75);
      auVar120 = vpandq_avx512vl(auVar66,auVar62);
      auVar68 = vpternlogq_avx512vl(auVar120,auVar69,auVar129,0xec);
      auVar120 = vpand_avx2(auVar62,local_340);
      auVar120 = vpsrlw_avx2(auVar120,1);
      auVar99._8_8_ = 0x7fc07fc07fc07fc0;
      auVar99._0_8_ = 0x7fc07fc07fc07fc0;
      auVar99._16_8_ = 0x7fc07fc07fc07fc0;
      auVar99._24_8_ = 0x7fc07fc07fc07fc0;
      auVar69 = vpternlogq_avx512vl(auVar120,auVar76,auVar99,0xec);
      auVar120 = vpand_avx2(auVar62,auVar86);
      auVar120 = vpsrlw_avx512vl(auVar120,2);
      auVar24._8_8_ = 0x3fc03fc03fc03fc0;
      auVar24._0_8_ = 0x3fc03fc03fc03fc0;
      auVar24._16_8_ = 0x3fc03fc03fc03fc0;
      auVar24._24_8_ = 0x3fc03fc03fc03fc0;
      auVar86 = vpternlogq_avx512vl(auVar120,auVar87,auVar24,0xec);
      vmovdqa64_avx512vl(auVar86);
      auVar120 = vpandq_avx512vl(auVar62,auVar89);
      auVar120 = vpsrlw_avx512vl(auVar120,3);
      auVar25._8_8_ = 0x1fc01fc01fc01fc0;
      auVar25._0_8_ = 0x1fc01fc01fc01fc0;
      auVar25._16_8_ = 0x1fc01fc01fc01fc0;
      auVar25._24_8_ = 0x1fc01fc01fc01fc0;
      auVar87 = vpternlogq_avx512vl(auVar120,auVar90,auVar25,0xec);
      vmovdqa64_avx512vl(auVar87);
      auVar120 = vpandq_avx512vl(auVar62,auVar70);
      auVar120 = vpsrlw_avx512vl(auVar120,4);
      auVar26._8_8_ = 0xfc00fc00fc00fc0;
      auVar26._0_8_ = 0xfc00fc00fc00fc0;
      auVar26._16_8_ = 0xfc00fc00fc00fc0;
      auVar26._24_8_ = 0xfc00fc00fc00fc0;
      auVar89 = vpternlogq_avx512vl(auVar120,auVar91,auVar26,0xec);
      vmovdqa64_avx512vl(auVar89);
      auVar120 = vpandq_avx512vl(auVar62,auVar82);
      auVar120 = vpsrlw_avx2(auVar120,5);
      auVar27._8_8_ = 0x7c007c007c007c0;
      auVar27._0_8_ = 0x7c007c007c007c0;
      auVar27._16_8_ = 0x7c007c007c007c0;
      auVar27._24_8_ = 0x7c007c007c007c0;
      auVar90 = vpternlogq_avx512vl(auVar120,auVar64,auVar27,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar83);
      auVar120 = vpsrlw_avx2(auVar120,6);
      auVar28._8_8_ = 0x3c003c003c003c0;
      auVar28._0_8_ = 0x3c003c003c003c0;
      auVar28._16_8_ = 0x3c003c003c003c0;
      auVar28._24_8_ = 0x3c003c003c003c0;
      auVar91 = vpternlogq_avx512vl(auVar120,auVar65,auVar28,0xec);
      auVar120 = vpand_avx2(auVar62,auVar74);
      auVar120 = vpsrlw_avx2(auVar120,7);
      auVar29._8_8_ = 0x1c001c001c001c0;
      auVar29._0_8_ = 0x1c001c001c001c0;
      auVar29._16_8_ = 0x1c001c001c001c0;
      auVar29._24_8_ = 0x1c001c001c001c0;
      auVar64 = vpternlogq_avx512vl(auVar120,auVar67,auVar29,0xec);
      auVar120 = vpand_avx2(auVar62,local_260);
      auVar120 = vpsrlw_avx512vl(auVar120,8);
      auVar30._8_8_ = 0xc000c000c000c0;
      auVar30._0_8_ = 0xc000c000c000c0;
      auVar30._16_8_ = 0xc000c000c000c0;
      auVar30._24_8_ = 0xc000c000c000c0;
      auVar65 = vpternlogq_avx512vl(auVar120,auVar72,auVar30,0xec);
      vmovdqa64_avx512vl(auVar65);
      auVar62 = vpandq_avx512vl(auVar62,auVar79);
      auVar62 = vpsrlw_avx2(auVar62,9);
      auVar31._8_8_ = 0x40004000400040;
      auVar31._0_8_ = 0x40004000400040;
      auVar31._16_8_ = 0x40004000400040;
      auVar31._24_8_ = 0x40004000400040;
      auVar93 = vpternlogq_avx512vl(auVar62,auVar93,auVar31,0xec);
      auVar62 = *(undefined1 (*) [32])(data + lVar59 * 0x10 + 0x70);
      auVar120 = vpand_avx2(local_420,auVar62);
      auVar120 = vpsllw_avx2(auVar120,7);
      auVar88 = vporq_avx512vl(auVar88,auVar120);
      auVar120 = vpand_avx2(local_400,auVar62);
      auVar67 = vmovdqa64_avx512vl(local_400);
      auVar120 = vpsllw_avx2(auVar120,6);
      auVar126._8_8_ = 0xff80ff80ff80ff80;
      auVar126._0_8_ = 0xff80ff80ff80ff80;
      auVar126._16_8_ = 0xff80ff80ff80ff80;
      auVar126._24_8_ = 0xff80ff80ff80ff80;
      auVar72 = vpternlogq_avx512vl(auVar120,auVar73,auVar126,0xec);
      auVar120 = vpand_avx2(local_3e0,auVar62);
      auVar120 = vpsllw_avx512vl(auVar120,5);
      auVar73 = vpternlogq_avx512vl(auVar120,auVar71,auVar126,0xec);
      auVar120 = vpand_avx2(local_3c0,auVar62);
      auVar120 = vpsllw_avx2(auVar120,4);
      auVar122 = vpternlogq_avx512vl(auVar120,auVar122,auVar126,0xec);
      auVar120 = vpand_avx2(local_3a0,auVar62);
      auVar120 = vpsllw_avx512vl(auVar120,3);
      auVar98 = vpternlogq_avx512vl(auVar120,auVar98,auVar126,0xec);
      auVar120 = vpand_avx2(local_380,auVar62);
      auVar120 = vpsllw_avx2(auVar120,2);
      auVar75 = vpternlogq_avx512vl(auVar120,auVar75,auVar126,0xec);
      auVar76 = vmovdqa64_avx512vl(local_360);
      auVar120 = vpandq_avx512vl(auVar76,auVar62);
      auVar120 = vpaddw_avx2(auVar120,auVar120);
      auVar68 = vpternlogq_avx512vl(auVar120,auVar68,auVar126,0xec);
      auVar120 = vpandq_avx512vl(auVar62,local_340);
      auVar69 = vpternlogq_avx512vl(auVar120,auVar69,auVar126,0xec);
      auVar70 = vmovdqa64_avx512vl(local_320);
      auVar74 = vpandq_avx512vl(auVar70,auVar62);
      auVar120 = vmovdqa64_avx512vl(auVar70);
      auVar74 = vpsrlw_avx2(auVar74,1);
      auVar32._8_8_ = 0x7f807f807f807f80;
      auVar32._0_8_ = 0x7f807f807f807f80;
      auVar32._16_8_ = 0x7f807f807f807f80;
      auVar32._24_8_ = 0x7f807f807f807f80;
      auVar86 = vpternlogq_avx512vl(auVar74,auVar86,auVar32,0xec);
      auVar74 = vpand_avx2(local_300,auVar62);
      auVar74 = vpsrlw_avx2(auVar74,2);
      auVar33._8_8_ = 0x3f803f803f803f80;
      auVar33._0_8_ = 0x3f803f803f803f80;
      auVar33._16_8_ = 0x3f803f803f803f80;
      auVar33._24_8_ = 0x3f803f803f803f80;
      auVar87 = vpternlogq_avx512vl(auVar74,auVar87,auVar33,0xec);
      auVar74 = vpand_avx2(local_2e0,auVar62);
      auVar74 = vpsrlw_avx512vl(auVar74,3);
      auVar34._8_8_ = 0x1f801f801f801f80;
      auVar34._0_8_ = 0x1f801f801f801f80;
      auVar34._16_8_ = 0x1f801f801f801f80;
      auVar34._24_8_ = 0x1f801f801f801f80;
      auVar89 = vpternlogq_avx512vl(auVar74,auVar89,auVar34,0xec);
      auVar71 = vmovdqa64_avx512vl(local_2c0);
      auVar74 = vpandq_avx512vl(auVar71,auVar62);
      auVar74 = vpsrlw_avx512vl(auVar74,4);
      auVar35._8_8_ = 0xf800f800f800f80;
      auVar35._0_8_ = 0xf800f800f800f80;
      auVar35._16_8_ = 0xf800f800f800f80;
      auVar35._24_8_ = 0xf800f800f800f80;
      auVar90 = vpternlogq_avx512vl(auVar74,auVar90,auVar35,0xec);
      auVar78 = vmovdqa64_avx512vl(local_2a0);
      auVar74 = vpandq_avx512vl(auVar78,auVar62);
      auVar74 = vpsrlw_avx512vl(auVar74,5);
      auVar36._8_8_ = 0x780078007800780;
      auVar36._0_8_ = 0x780078007800780;
      auVar36._16_8_ = 0x780078007800780;
      auVar36._24_8_ = 0x780078007800780;
      auVar91 = vpternlogq_avx512vl(auVar74,auVar91,auVar36,0xec);
      auVar79 = vmovdqa64_avx512vl(local_280);
      auVar74 = vpandq_avx512vl(auVar79,auVar62);
      auVar74 = vpsrlw_avx2(auVar74,6);
      auVar37._8_8_ = 0x380038003800380;
      auVar37._0_8_ = 0x380038003800380;
      auVar37._16_8_ = 0x380038003800380;
      auVar37._24_8_ = 0x380038003800380;
      auVar64 = vpternlogq_avx512vl(auVar74,auVar64,auVar37,0xec);
      local_4c0 = local_260;
      auVar74 = vpand_avx2(local_260,auVar62);
      auVar74 = vpsrlw_avx2(auVar74,7);
      auVar38._8_8_ = 0x180018001800180;
      auVar38._0_8_ = 0x180018001800180;
      auVar38._16_8_ = 0x180018001800180;
      auVar38._24_8_ = 0x180018001800180;
      auVar65 = vpternlogq_avx512vl(auVar74,auVar65,auVar38,0xec);
      auVar62 = vpand_avx2(local_240,auVar62);
      auVar62 = vpsrlw_avx2(auVar62,8);
      auVar39._8_8_ = 0x80008000800080;
      auVar39._0_8_ = 0x80008000800080;
      auVar39._16_8_ = 0x80008000800080;
      auVar39._24_8_ = 0x80008000800080;
      auVar80 = vpternlogq_avx512vl(auVar62,auVar93,auVar39,0xec);
      vmovdqa64_avx512vl(auVar88);
      vmovdqa64_avx512vl(auVar73);
      vmovdqa64_avx512vl(auVar98);
      vmovdqa64_avx512vl(auVar69);
      vmovdqa64_avx512vl(auVar89);
      vmovdqa64_avx512vl(auVar90);
      vmovdqa64_avx512vl(auVar91);
      auVar62 = *(undefined1 (*) [32])(data + lVar59 * 0x10 + 0x80);
      auVar74 = vpand_avx2(auVar62,local_420);
      auVar74 = vpsllw_avx2(auVar74,8);
      auVar88 = vporq_avx512vl(auVar88,auVar74);
      auVar74 = vpandq_avx512vl(auVar62,auVar67);
      auVar74 = vpsllw_avx2(auVar74,7);
      auVar104._8_2_ = 0xff00;
      auVar104._0_8_ = 0xff00ff00ff00ff00;
      auVar104._10_2_ = 0xff00;
      auVar104._12_2_ = 0xff00;
      auVar104._14_2_ = 0xff00;
      auVar104._16_2_ = 0xff00;
      auVar104._18_2_ = 0xff00;
      auVar104._20_2_ = 0xff00;
      auVar104._22_2_ = 0xff00;
      auVar104._24_2_ = 0xff00;
      auVar104._26_2_ = 0xff00;
      auVar104._28_2_ = 0xff00;
      auVar104._30_2_ = 0xff00;
      auVar67 = vpternlogq_avx512vl(auVar74,auVar72,auVar104,0xec);
      auVar72 = vmovdqa64_avx512vl(local_3e0);
      auVar74 = vpandq_avx512vl(auVar62,auVar72);
      auVar74 = vpsllw_avx2(auVar74,6);
      auVar73 = vpternlogq_avx512vl(auVar74,auVar73,auVar104,0xec);
      auVar74 = vpand_avx2(auVar62,local_3c0);
      auVar74 = vpsllw_avx2(auVar74,5);
      auVar77 = vpternlogq_avx512vl(auVar74,auVar122,auVar104,0xec);
      auVar81 = vmovdqa64_avx512vl(local_3a0);
      auVar74 = vpandq_avx512vl(auVar62,auVar81);
      auVar74 = vpsllw_avx2(auVar74,4);
      auVar98 = vpternlogq_avx512vl(auVar74,auVar98,auVar104,0xec);
      auVar82 = vmovdqa64_avx512vl(local_380);
      auVar74 = vpandq_avx512vl(auVar62,auVar82);
      auVar74 = vpsllw_avx512vl(auVar74,3);
      auVar75 = vpternlogq_avx512vl(auVar74,auVar75,auVar104,0xec);
      auVar74 = vpandq_avx512vl(auVar62,auVar76);
      auVar74 = vpsllw_avx512vl(auVar74,2);
      auVar68 = vpternlogq_avx512vl(auVar74,auVar68,auVar104,0xec);
      auVar63 = vmovdqa64_avx512vl(local_340);
      auVar74 = vpandq_avx512vl(auVar62,auVar63);
      auVar74 = vpaddw_avx2(auVar74,auVar74);
      auVar69 = vpternlogq_avx512vl(auVar74,auVar69,auVar104,0xec);
      auVar74 = vpandq_avx512vl(auVar70,auVar62);
      auVar86 = vpternlogq_avx512vl(auVar74,auVar86,auVar104,0xec);
      auVar70 = vmovdqa64_avx512vl(local_300);
      auVar74 = vpandq_avx512vl(auVar62,auVar70);
      auVar74 = vpsrlw_avx512vl(auVar74,1);
      auVar40._8_8_ = 0x7f007f007f007f00;
      auVar40._0_8_ = 0x7f007f007f007f00;
      auVar40._16_8_ = 0x7f007f007f007f00;
      auVar40._24_8_ = 0x7f007f007f007f00;
      auVar87 = vpternlogq_avx512vl(auVar74,auVar87,auVar40,0xec);
      auVar66 = vmovdqa64_avx512vl(local_2e0);
      auVar74 = vpandq_avx512vl(auVar62,auVar66);
      auVar74 = vpsrlw_avx2(auVar74,2);
      auVar41._8_8_ = 0x3f003f003f003f00;
      auVar41._0_8_ = 0x3f003f003f003f00;
      auVar41._16_8_ = 0x3f003f003f003f00;
      auVar41._24_8_ = 0x3f003f003f003f00;
      auVar89 = vpternlogq_avx512vl(auVar74,auVar89,auVar41,0xec);
      auVar74 = vpandq_avx512vl(auVar62,auVar71);
      auVar74 = vpsrlw_avx512vl(auVar74,3);
      auVar42._8_8_ = 0x1f001f001f001f00;
      auVar42._0_8_ = 0x1f001f001f001f00;
      auVar42._16_8_ = 0x1f001f001f001f00;
      auVar42._24_8_ = 0x1f001f001f001f00;
      auVar90 = vpternlogq_avx512vl(auVar74,auVar90,auVar42,0xec);
      auVar74 = vmovdqa64_avx512vl(auVar78);
      auVar93 = vpandq_avx512vl(auVar62,auVar78);
      auVar93 = vpsrlw_avx512vl(auVar93,4);
      auVar43._8_8_ = 0xf000f000f000f00;
      auVar43._0_8_ = 0xf000f000f000f00;
      auVar43._16_8_ = 0xf000f000f000f00;
      auVar43._24_8_ = 0xf000f000f000f00;
      auVar91 = vpternlogq_avx512vl(auVar93,auVar91,auVar43,0xec);
      auVar93 = vpandq_avx512vl(auVar62,auVar79);
      auVar93 = vpsrlw_avx512vl(auVar93,5);
      auVar44._8_8_ = 0x700070007000700;
      auVar44._0_8_ = 0x700070007000700;
      auVar44._16_8_ = 0x700070007000700;
      auVar44._24_8_ = 0x700070007000700;
      auVar64 = vpternlogq_avx512vl(auVar93,auVar64,auVar44,0xec);
      auVar93 = vpand_avx2(auVar62,local_260);
      auVar93 = vpsrlw_avx2(auVar93,6);
      auVar45._8_8_ = 0x300030003000300;
      auVar45._0_8_ = 0x300030003000300;
      auVar45._16_8_ = 0x300030003000300;
      auVar45._24_8_ = 0x300030003000300;
      auVar65 = vpternlogq_avx512vl(auVar93,auVar65,auVar45,0xec);
      auVar62 = vpand_avx2(auVar62,local_240);
      auVar62 = vpsrlw_avx2(auVar62,7);
      auVar46._8_8_ = 0x100010001000100;
      auVar46._0_8_ = 0x100010001000100;
      auVar46._16_8_ = 0x100010001000100;
      auVar46._24_8_ = 0x100010001000100;
      auVar80 = vpternlogq_avx512vl(auVar62,auVar80,auVar46,0xec);
      vmovdqa64_avx512vl(auVar75);
      vmovdqa64_avx512vl(auVar68);
      vmovdqa64_avx512vl(auVar87);
      vmovdqa64_avx512vl(auVar90);
      vmovdqa64_avx512vl(auVar91);
      vmovdqa64_avx512vl(auVar64);
      auVar62 = *(undefined1 (*) [32])(data + lVar59 * 0x10 + 0x90);
      auVar93 = vpand_avx2(local_420,auVar62);
      auVar93 = vpsllw_avx2(auVar93,9);
      auVar122 = vpor_avx2(auVar88,auVar93);
      auVar93 = vpand_avx2(local_400,auVar62);
      auVar93 = vpsllw_avx2(auVar93,8);
      auVar127._8_8_ = 0xfe00fe00fe00fe00;
      auVar127._0_8_ = 0xfe00fe00fe00fe00;
      auVar127._16_8_ = 0xfe00fe00fe00fe00;
      auVar127._24_8_ = 0xfe00fe00fe00fe00;
      auVar93 = vpternlogq_avx512vl(auVar93,auVar67,auVar127,0xec);
      auVar88 = vpandq_avx512vl(auVar62,auVar72);
      auVar88 = vpsllw_avx2(auVar88,7);
      auVar88 = vpternlogq_avx512vl(auVar88,auVar73,auVar127,0xec);
      auVar67 = vmovdqa64_avx512vl(local_3c0);
      auVar72 = vpandq_avx512vl(auVar62,auVar67);
      auVar72 = vpsllw_avx2(auVar72,6);
      auVar72 = vpternlogq_avx512vl(auVar72,auVar77,auVar127,0xec);
      auVar73 = vpandq_avx512vl(auVar62,auVar81);
      auVar73 = vpsllw_avx2(auVar73,5);
      auVar98 = vpternlogq_avx512vl(auVar73,auVar98,auVar127,0xec);
      auVar73 = vpandq_avx512vl(auVar62,auVar82);
      auVar73 = vpsllw_avx2(auVar73,4);
      auVar73 = vpternlogq_avx512vl(auVar73,auVar75,auVar127,0xec);
      auVar75 = vpandq_avx512vl(auVar62,auVar76);
      auVar75 = vpsllw_avx2(auVar75,3);
      auVar75 = vpternlogq_avx512vl(auVar75,auVar68,auVar127,0xec);
      auVar68 = vpandq_avx512vl(auVar62,auVar63);
      auVar68 = vpsllw_avx512vl(auVar68,2);
      auVar68 = vpternlogq_avx512vl(auVar68,auVar69,auVar127,0xec);
      auVar69 = vmovdqa64_avx512vl(auVar120);
      auVar120 = vpandq_avx512vl(auVar62,auVar69);
      auVar120 = vpaddw_avx512vl(auVar120,auVar120);
      auVar86 = vpternlogq_avx512vl(auVar120,auVar86,auVar127,0xec);
      auVar120 = vpandq_avx512vl(auVar70,auVar62);
      auVar87 = vpternlogq_avx512vl(auVar120,auVar87,auVar127,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar66);
      auVar120 = vpsrlw_avx2(auVar120,1);
      auVar47._8_8_ = 0x7e007e007e007e00;
      auVar47._0_8_ = 0x7e007e007e007e00;
      auVar47._16_8_ = 0x7e007e007e007e00;
      auVar47._24_8_ = 0x7e007e007e007e00;
      auVar89 = vpternlogq_avx512vl(auVar120,auVar89,auVar47,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar71);
      auVar70 = vmovdqa64_avx512vl(auVar71);
      auVar120 = vpsrlw_avx2(auVar120,2);
      auVar48._8_8_ = 0x3e003e003e003e00;
      auVar48._0_8_ = 0x3e003e003e003e00;
      auVar48._16_8_ = 0x3e003e003e003e00;
      auVar48._24_8_ = 0x3e003e003e003e00;
      auVar90 = vpternlogq_avx512vl(auVar120,auVar90,auVar48,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar78);
      auVar120 = vpsrlw_avx2(auVar120,3);
      auVar49._8_8_ = 0x1e001e001e001e00;
      auVar49._0_8_ = 0x1e001e001e001e00;
      auVar49._16_8_ = 0x1e001e001e001e00;
      auVar49._24_8_ = 0x1e001e001e001e00;
      auVar91 = vpternlogq_avx512vl(auVar120,auVar91,auVar49,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar79);
      auVar120 = vpsrlw_avx512vl(auVar120,4);
      auVar50._8_8_ = 0xe000e000e000e00;
      auVar50._0_8_ = 0xe000e000e000e00;
      auVar50._16_8_ = 0xe000e000e000e00;
      auVar50._24_8_ = 0xe000e000e000e00;
      auVar64 = vpternlogq_avx512vl(auVar120,auVar64,auVar50,0xec);
      auVar71 = vmovdqa64_avx512vl(local_260);
      auVar120 = vpandq_avx512vl(auVar62,auVar71);
      auVar120 = vpsrlw_avx512vl(auVar120,5);
      auVar51._8_8_ = 0x600060006000600;
      auVar51._0_8_ = 0x600060006000600;
      auVar51._16_8_ = 0x600060006000600;
      auVar51._24_8_ = 0x600060006000600;
      auVar65 = vpternlogq_avx512vl(auVar120,auVar65,auVar51,0xec);
      auVar78 = vmovdqa64_avx512vl(local_240);
      auVar62 = vpandq_avx512vl(auVar62,auVar78);
      auVar62 = vpsrlw_avx512vl(auVar62,6);
      auVar52._8_8_ = 0x200020002000200;
      auVar52._0_8_ = 0x200020002000200;
      auVar52._16_8_ = 0x200020002000200;
      auVar52._24_8_ = 0x200020002000200;
      auVar80 = vpternlogq_avx512vl(auVar62,auVar80,auVar52,0xec);
      vmovdqa64_avx512vl(auVar68);
      vmovdqa64_avx512vl(auVar86);
      vmovdqa64_avx512vl(auVar64);
      vmovdqa64_avx512vl(auVar65);
      vmovdqa64_avx512vl(auVar80);
      auVar62 = *(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xa0);
      auVar77 = vmovdqa64_avx512vl(local_420);
      auVar120 = vpandq_avx512vl(auVar62,auVar77);
      auVar120 = vpsllw_avx2(auVar120,10);
      auVar122 = vporq_avx512vl(auVar122,auVar120);
      auVar120 = vpand_avx2(local_400,auVar62);
      auVar81 = vmovdqa64_avx512vl(local_400);
      auVar120 = vpsllw_avx2(auVar120,9);
      auVar128._8_8_ = 0xfc00fc00fc00fc00;
      auVar128._0_8_ = 0xfc00fc00fc00fc00;
      auVar128._16_8_ = 0xfc00fc00fc00fc00;
      auVar128._24_8_ = 0xfc00fc00fc00fc00;
      auVar93 = vpternlogq_avx512vl(auVar120,auVar93,auVar128,0xec);
      auVar120 = vpand_avx2(local_3e0,auVar62);
      auVar120 = vpsllw_avx2(auVar120,8);
      auVar88 = vpternlogq_avx512vl(auVar120,auVar88,auVar128,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar67);
      auVar67 = vmovdqa64_avx512vl(auVar67);
      auVar120 = vpsllw_avx2(auVar120,7);
      auVar72 = vpternlogq_avx512vl(auVar120,auVar72,auVar128,0xec);
      auVar82 = vmovdqa64_avx512vl(local_3a0);
      auVar120 = vpandq_avx512vl(auVar62,auVar82);
      auVar120 = vpsllw_avx2(auVar120,6);
      auVar98 = vpternlogq_avx512vl(auVar120,auVar98,auVar128,0xec);
      auVar120 = vpand_avx2(auVar62,local_380);
      auVar120 = vpsllw_avx2(auVar120,5);
      auVar73 = vpternlogq_avx512vl(auVar120,auVar73,auVar128,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar76);
      auVar120 = vpsllw_avx2(auVar120,4);
      auVar75 = vpternlogq_avx512vl(auVar120,auVar75,auVar128,0xec);
      auVar120 = vpand_avx2(auVar62,local_340);
      auVar120 = vpsllw_avx2(auVar120,3);
      auVar68 = vpternlogq_avx512vl(auVar120,auVar68,auVar128,0xec);
      vmovdqa64_avx512vl(auVar122);
      auVar120 = vpandq_avx512vl(auVar62,auVar69);
      auVar120 = vpsllw_avx2(auVar120,2);
      auVar86 = vpternlogq_avx512vl(auVar120,auVar86,auVar128,0xec);
      auVar120 = vpand_avx2(auVar62,local_300);
      auVar120 = vpaddw_avx2(auVar120,auVar120);
      auVar87 = vpternlogq_avx512vl(auVar120,auVar87,auVar128,0xec);
      auVar120 = vpand_avx2(auVar62,local_2e0);
      auVar89 = vpternlogq_avx512vl(auVar120,auVar89,auVar128,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar70);
      auVar120 = vpsrlw_avx2(auVar120,1);
      auVar53._8_8_ = 0x7c007c007c007c00;
      auVar53._0_8_ = 0x7c007c007c007c00;
      auVar53._16_8_ = 0x7c007c007c007c00;
      auVar53._24_8_ = 0x7c007c007c007c00;
      auVar90 = vpternlogq_avx512vl(auVar120,auVar90,auVar53,0xec);
      auVar120 = vpand_avx2(auVar62,auVar74);
      auVar120 = vpsrlw_avx2(auVar120,2);
      auVar54._8_8_ = 0x3c003c003c003c00;
      auVar54._0_8_ = 0x3c003c003c003c00;
      auVar54._16_8_ = 0x3c003c003c003c00;
      auVar54._24_8_ = 0x3c003c003c003c00;
      auVar74 = vpternlogq_avx512vl(auVar120,auVar91,auVar54,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar79);
      auVar120 = vpsrlw_avx2(auVar120,3);
      auVar55._8_8_ = 0x1c001c001c001c00;
      auVar55._0_8_ = 0x1c001c001c001c00;
      auVar55._16_8_ = 0x1c001c001c001c00;
      auVar55._24_8_ = 0x1c001c001c001c00;
      auVar91 = vpternlogq_avx512vl(auVar120,auVar64,auVar55,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar71);
      auVar120 = vpsrlw_avx2(auVar120,4);
      auVar56._8_8_ = 0xc000c000c000c00;
      auVar56._0_8_ = 0xc000c000c000c00;
      auVar56._16_8_ = 0xc000c000c000c00;
      auVar56._24_8_ = 0xc000c000c000c00;
      auVar64 = vpternlogq_avx512vl(auVar120,auVar65,auVar56,0xec);
      auVar62 = vpandq_avx512vl(auVar62,auVar78);
      auVar62 = vpsrlw_avx2(auVar62,5);
      auVar57._8_8_ = 0x400040004000400;
      auVar57._0_8_ = 0x400040004000400;
      auVar57._16_8_ = 0x400040004000400;
      auVar57._24_8_ = 0x400040004000400;
      auVar65 = vpternlogq_avx512vl(auVar62,auVar80,auVar57,0xec);
      auVar62 = *(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0);
      auVar120 = vpandq_avx512vl(auVar62,auVar77);
      auVar120 = vpsllw_avx2(auVar120,0xb);
      auVar122 = vporq_avx512vl(auVar122,auVar120);
      auVar120 = vpandq_avx512vl(auVar62,auVar81);
      auVar120 = vpsllw_avx2(auVar120,10);
      auVar121._8_8_ = 0xf800f800f800f800;
      auVar121._0_8_ = 0xf800f800f800f800;
      auVar121._16_8_ = 0xf800f800f800f800;
      auVar121._24_8_ = 0xf800f800f800f800;
      auVar93 = vpternlogq_avx512vl(auVar120,auVar93,auVar121,0xec);
      auVar120 = vpand_avx2(local_3e0,auVar62);
      auVar120 = vpsllw_avx2(auVar120,9);
      auVar88 = vpternlogq_avx512vl(auVar120,auVar88,auVar121,0xec);
      auVar120 = vpandq_avx512vl(auVar62,auVar67);
      auVar120 = vpsllw_avx2(auVar120,8);
      auVar67 = vpternlogq_avx512vl(auVar120,auVar72,auVar121,0xec);
      auVar62 = vpandq_avx512vl(auVar62,auVar82);
      auVar62 = vpsllw_avx2(auVar62,7);
      auVar98 = vpternlogq_avx512vl(auVar62,auVar98,auVar121,0xec);
      auVar62 = vpand_avx2(local_380,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0));
      auVar62 = vpsllw_avx2(auVar62,6);
      auVar72 = vpternlogq_avx512vl(auVar62,auVar73,auVar121,0xec);
      auVar62 = vpand_avx2(local_360,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0));
      auVar62 = vpsllw_avx2(auVar62,5);
      auVar73 = vpternlogq_avx512vl(auVar62,auVar75,auVar121,0xec);
      auVar62 = vpand_avx2(local_340,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0));
      auVar62 = vpsllw_avx2(auVar62,4);
      auVar75 = vpternlogq_avx512vl(auVar62,auVar121,auVar68,0xea);
      auVar62 = vpand_avx2(local_320,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0));
      auVar62 = vpsllw_avx2(auVar62,3);
      auVar86 = vpternlogq_avx512vl(auVar62,auVar121,auVar86,0xea);
      auVar62 = vpand_avx2(local_300,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0));
      auVar62 = vpsllw_avx2(auVar62,2);
      auVar87 = vpternlogq_avx512vl(auVar62,auVar121,auVar87,0xea);
      auVar62 = vpand_avx2(local_2e0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0));
      auVar62 = vpaddw_avx2(auVar62,auVar62);
      auVar89 = vpternlogq_avx512vl(auVar62,auVar121,auVar89,0xea);
      auVar62 = vpand_avx2(*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0),local_2c0);
      auVar90 = vpternlogq_avx512vl(auVar62,auVar121,auVar90,0xea);
      auVar62 = vpand_avx2(local_2a0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0));
      auVar62 = vpsrlw_avx2(auVar62,1);
      auVar106._8_8_ = 0x7800780078007800;
      auVar106._0_8_ = 0x7800780078007800;
      auVar106._16_8_ = 0x7800780078007800;
      auVar106._24_8_ = 0x7800780078007800;
      auVar74 = vpternlogq_avx512vl(auVar62,auVar106,auVar74,0xea);
      auVar62 = vpand_avx2(local_280,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0));
      auVar62 = vpsrlw_avx2(auVar62,2);
      auVar107._8_8_ = 0x3800380038003800;
      auVar107._0_8_ = 0x3800380038003800;
      auVar107._16_8_ = 0x3800380038003800;
      auVar107._24_8_ = 0x3800380038003800;
      auVar91 = vpternlogq_avx512vl(auVar62,auVar107,auVar91,0xea);
      auVar62 = vpand_avx2(local_260,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0));
      auVar62 = vpsrlw_avx2(auVar62,3);
      auVar108._8_8_ = 0x1800180018001800;
      auVar108._0_8_ = 0x1800180018001800;
      auVar108._16_8_ = 0x1800180018001800;
      auVar108._24_8_ = 0x1800180018001800;
      auVar64 = vpternlogq_avx512vl(auVar62,auVar108,auVar64,0xea);
      auVar62 = vpand_avx2(local_240,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xb0));
      auVar62 = vpsrlw_avx2(auVar62,4);
      auVar109._8_8_ = 0x800080008000800;
      auVar109._0_8_ = 0x800080008000800;
      auVar109._16_8_ = 0x800080008000800;
      auVar109._24_8_ = 0x800080008000800;
      auVar65 = vpternlogq_avx512vl(auVar62,auVar109,auVar65,0xea);
      auVar62 = vpand_avx2(local_420,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,0xc);
      auVar120 = vpor_avx2(auVar62,auVar122);
      auVar62 = vpand_avx2(local_400,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,0xb);
      auVar110._8_8_ = 0xf000f000f000f000;
      auVar110._0_8_ = 0xf000f000f000f000;
      auVar110._16_8_ = 0xf000f000f000f000;
      auVar110._24_8_ = 0xf000f000f000f000;
      auVar93 = vpternlogq_avx512vl(auVar62,auVar110,auVar93,0xea);
      auVar62 = vpand_avx2(local_3e0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,10);
      auVar122 = vpternlogq_avx512vl(auVar62,auVar110,auVar88,0xea);
      auVar62 = vpand_avx2(local_3c0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,9);
      auVar88 = vpternlogq_avx512vl(auVar62,auVar110,auVar67,0xea);
      auVar62 = vpand_avx2(local_3a0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,8);
      auVar98 = vpternlogq_avx512vl(auVar62,auVar110,auVar98,0xea);
      auVar62 = vpand_avx2(local_380,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,7);
      auVar67 = vpternlogq_avx512vl(auVar62,auVar110,auVar72,0xea);
      auVar62 = vpand_avx2(local_360,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,6);
      auVar72 = vpternlogq_avx512vl(auVar62,auVar110,auVar73,0xea);
      auVar62 = vpand_avx2(local_340,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,5);
      auVar73 = vpternlogq_avx512vl(auVar62,auVar110,auVar75,0xea);
      auVar62 = vpand_avx2(local_320,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,4);
      auVar86 = vpternlogq_avx512vl(auVar62,auVar110,auVar86,0xea);
      auVar62 = vpand_avx2(local_300,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,3);
      auVar87 = vpternlogq_avx512vl(auVar62,auVar110,auVar87,0xea);
      auVar62 = vpand_avx2(local_2e0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsllw_avx2(auVar62,2);
      auVar89 = vpternlogq_avx512vl(auVar62,auVar110,auVar89,0xea);
      auVar62 = vpand_avx2(local_2c0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpaddw_avx2(auVar62,auVar62);
      auVar90 = vpternlogq_avx512vl(auVar62,auVar110,auVar90,0xea);
      auVar62 = vpand_avx2(*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0),local_2a0);
      auVar74 = vpternlogq_avx512vl(auVar62,auVar110,auVar74,0xea);
      auVar62 = vpand_avx2(local_280,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsrlw_avx2(auVar62,1);
      auVar111._8_8_ = 0x7000700070007000;
      auVar111._0_8_ = 0x7000700070007000;
      auVar111._16_8_ = 0x7000700070007000;
      auVar111._24_8_ = 0x7000700070007000;
      auVar91 = vpternlogq_avx512vl(auVar62,auVar111,auVar91,0xea);
      auVar62 = vpand_avx2(local_260,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsrlw_avx2(auVar62,2);
      auVar112._8_8_ = 0x3000300030003000;
      auVar112._0_8_ = 0x3000300030003000;
      auVar112._16_8_ = 0x3000300030003000;
      auVar112._24_8_ = 0x3000300030003000;
      auVar64 = vpternlogq_avx512vl(auVar62,auVar112,auVar64,0xea);
      auVar62 = vpand_avx2(local_240,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xc0));
      auVar62 = vpsrlw_avx2(auVar62,3);
      auVar113._8_8_ = 0x1000100010001000;
      auVar113._0_8_ = 0x1000100010001000;
      auVar113._16_8_ = 0x1000100010001000;
      auVar113._24_8_ = 0x1000100010001000;
      auVar65 = vpternlogq_avx512vl(auVar62,auVar113,auVar65,0xea);
      auVar62 = vpand_avx2(local_420,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,0xd);
      auVar120 = vpor_avx2(auVar62,auVar120);
      auVar62 = vpand_avx2(local_400,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,0xc);
      auVar114._8_8_ = 0xe000e000e000e000;
      auVar114._0_8_ = 0xe000e000e000e000;
      auVar114._16_8_ = 0xe000e000e000e000;
      auVar114._24_8_ = 0xe000e000e000e000;
      auVar93 = vpternlogq_avx512vl(auVar62,auVar114,auVar93,0xea);
      auVar62 = vpand_avx2(local_3e0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,0xb);
      auVar122 = vpternlogq_avx512vl(auVar62,auVar114,auVar122,0xea);
      auVar62 = vpand_avx2(local_3c0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,10);
      auVar88 = vpternlogq_avx512vl(auVar62,auVar114,auVar88,0xea);
      auVar62 = vpand_avx2(local_3a0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,9);
      auVar98 = vpternlogq_avx512vl(auVar62,auVar114,auVar98,0xea);
      auVar62 = vpand_avx2(local_380,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,8);
      auVar67 = vpternlogq_avx512vl(auVar62,auVar114,auVar67,0xea);
      auVar62 = vpand_avx2(local_360,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,7);
      auVar72 = vpternlogq_avx512vl(auVar62,auVar114,auVar72,0xea);
      auVar62 = vpand_avx2(local_340,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,6);
      auVar73 = vpternlogq_avx512vl(auVar62,auVar114,auVar73,0xea);
      auVar62 = vpand_avx2(local_320,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,5);
      auVar86 = vpternlogq_avx512vl(auVar62,auVar114,auVar86,0xea);
      auVar62 = vpand_avx2(local_300,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,4);
      auVar87 = vpternlogq_avx512vl(auVar62,auVar114,auVar87,0xea);
      auVar62 = vpand_avx2(local_2e0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,3);
      auVar89 = vpternlogq_avx512vl(auVar62,auVar114,auVar89,0xea);
      auVar62 = vpand_avx2(local_2c0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsllw_avx2(auVar62,2);
      auVar90 = vpternlogq_avx512vl(auVar62,auVar114,auVar90,0xea);
      auVar62 = vpand_avx2(local_2a0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpaddw_avx2(auVar62,auVar62);
      auVar74 = vpternlogq_avx512vl(auVar62,auVar114,auVar74,0xea);
      auVar62 = vpand_avx2(*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0),local_280);
      auVar91 = vpternlogq_avx512vl(auVar62,auVar114,auVar91,0xea);
      auVar62 = vpand_avx2(local_260,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsrlw_avx2(auVar62,1);
      auVar115._8_8_ = 0x6000600060006000;
      auVar115._0_8_ = 0x6000600060006000;
      auVar115._16_8_ = 0x6000600060006000;
      auVar115._24_8_ = 0x6000600060006000;
      auVar64 = vpternlogq_avx512vl(auVar62,auVar115,auVar64,0xea);
      auVar62 = vpand_avx2(local_240,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xd0));
      auVar62 = vpsrlw_avx2(auVar62,2);
      auVar116._8_8_ = 0x2000200020002000;
      auVar116._0_8_ = 0x2000200020002000;
      auVar116._16_8_ = 0x2000200020002000;
      auVar116._24_8_ = 0x2000200020002000;
      auVar65 = vpternlogq_avx512vl(auVar62,auVar116,auVar65,0xea);
      auVar62 = vpand_avx2(local_420,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,0xe);
      auVar120 = vpor_avx2(auVar62,auVar120);
      auVar62 = vpand_avx2(local_400,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,0xd);
      auVar117._8_8_ = 0xc000c000c000c000;
      auVar117._0_8_ = 0xc000c000c000c000;
      auVar117._16_8_ = 0xc000c000c000c000;
      auVar117._24_8_ = 0xc000c000c000c000;
      auVar93 = vpternlogq_avx512vl(auVar62,auVar117,auVar93,0xea);
      auVar62 = vpand_avx2(local_3e0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,0xc);
      auVar122 = vpternlogq_avx512vl(auVar62,auVar117,auVar122,0xea);
      auVar62 = vpand_avx2(local_3c0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,0xb);
      auVar88 = vpternlogq_avx512vl(auVar62,auVar117,auVar88,0xea);
      auVar62 = vpand_avx2(local_3a0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,10);
      auVar98 = vpternlogq_avx512vl(auVar62,auVar117,auVar98,0xea);
      auVar62 = vpand_avx2(local_380,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,9);
      auVar67 = vpternlogq_avx512vl(auVar62,auVar117,auVar67,0xea);
      auVar62 = vpand_avx2(local_360,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,8);
      auVar72 = vpternlogq_avx512vl(auVar62,auVar117,auVar72,0xea);
      auVar62 = vpand_avx2(local_340,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,7);
      auVar73 = vpternlogq_avx512vl(auVar62,auVar117,auVar73,0xea);
      auVar62 = vpand_avx2(local_320,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,6);
      auVar86 = vpternlogq_avx512vl(auVar62,auVar117,auVar86,0xea);
      auVar62 = vpand_avx2(local_300,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,5);
      auVar87 = vpternlogq_avx512vl(auVar62,auVar117,auVar87,0xea);
      auVar62 = vpand_avx2(local_2e0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,4);
      auVar89 = vpternlogq_avx512vl(auVar62,auVar117,auVar89,0xea);
      auVar62 = vpand_avx2(local_2c0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,3);
      auVar90 = vpternlogq_avx512vl(auVar62,auVar117,auVar90,0xea);
      auVar62 = vpand_avx2(local_2a0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsllw_avx2(auVar62,2);
      auVar74 = vpternlogq_avx512vl(auVar62,auVar117,auVar74,0xea);
      auVar62 = vpand_avx2(local_280,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpaddw_avx2(auVar62,auVar62);
      auVar91 = vpternlogq_avx512vl(auVar62,auVar117,auVar91,0xea);
      auVar62 = vpand_avx2(*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0),local_260);
      auVar64 = vpternlogq_avx512vl(auVar62,auVar117,auVar64,0xea);
      auVar62 = vpand_avx2(local_240,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xe0));
      auVar62 = vpsrlw_avx2(auVar62,1);
      auVar118._8_8_ = 0x4000400040004000;
      auVar118._0_8_ = 0x4000400040004000;
      auVar118._16_8_ = 0x4000400040004000;
      auVar118._24_8_ = 0x4000400040004000;
      auVar65 = vpternlogq_avx512vl(auVar62,auVar118,auVar65,0xea);
      auVar62 = vpand_avx2(local_420,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,0xf);
      local_6c0._0_32_ = vpor_avx2(auVar62,auVar120);
      auVar62 = vpand_avx2(local_400,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,0xe);
      auVar119._8_8_ = 0x8000800080008000;
      auVar119._0_8_ = 0x8000800080008000;
      auVar119._16_8_ = 0x8000800080008000;
      auVar119._24_8_ = 0x8000800080008000;
      local_6c0._32_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar93,0xea);
      auVar62 = vpand_avx2(local_3e0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,0xd);
      local_680._0_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar122,0xea);
      auVar62 = vpand_avx2(local_3c0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,0xc);
      local_680._32_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar88,0xea);
      auVar62 = vpand_avx2(local_3a0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,0xb);
      local_640._0_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar98,0xea);
      auVar62 = vpand_avx2(local_380,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,10);
      local_640._32_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar67,0xea);
      auVar62 = vpand_avx2(local_360,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,9);
      local_600._0_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar72,0xea);
      auVar62 = vpand_avx2(local_340,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,8);
      local_600._32_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar73,0xea);
      auVar62 = vpand_avx2(local_320,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,7);
      local_5c0._0_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar86,0xea);
      auVar62 = vpand_avx2(local_300,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,6);
      local_5c0._32_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar87,0xea);
      auVar62 = vpand_avx2(local_2e0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,5);
      local_580._0_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar89,0xea);
      auVar62 = vpand_avx2(local_2c0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,4);
      local_580._32_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar90,0xea);
      auVar62 = vpand_avx2(local_2a0,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,3);
      local_540._0_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar74,0xea);
      auVar62 = vpand_avx2(local_280,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpsllw_avx2(auVar62,2);
      local_540._32_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar91,0xea);
      auVar62 = vpand_avx2(local_260,*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0));
      auVar62 = vpaddw_avx2(auVar62,auVar62);
      local_500._0_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar64,0xea);
      auVar62 = vpand_avx2(*(undefined1 (*) [32])(data + lVar59 * 0x10 + 0xf0),local_240);
      local_500._32_32_ = vpternlogq_avx512vl(auVar62,auVar119,auVar65,0xea);
      lVar61 = 0;
      do {
        *(int *)(local_100[0] + lVar61) =
             (int)POPCOUNT(*(undefined8 *)(local_6c0 + lVar61 * 8 + 0x18)) +
             (int)POPCOUNT(*(undefined8 *)(local_6c0 + lVar61 * 8 + 0x10)) +
             (int)POPCOUNT(*(undefined8 *)(local_6c0 + lVar61 * 8 + 8)) +
             (int)POPCOUNT(*(undefined8 *)(local_6c0 + lVar61 * 8)) +
             *(int *)(local_100[0] + lVar61);
        lVar1 = lVar61 * 8;
        *(undefined8 *)(local_6c0 + lVar1) = 0;
        *(undefined8 *)(local_6c0 + lVar1 + 8) = 0;
        *(undefined8 *)(local_6c0 + lVar1 + 0x10) = 0;
        *(undefined8 *)(local_6c0 + lVar1 + 0x18) = 0;
        lVar61 = lVar61 + 4;
      } while (lVar61 != 0x40);
      lVar59 = lVar59 + 0x10;
      uVar60 = uVar60 + 1;
    } while (uVar60 != len >> 8);
    uVar60 = (ulong)(uint)((int)lVar59 << 4);
  }
  if ((uint)uVar60 < len) {
    auVar105 = vmovdqa64_avx512f(local_100[0]);
    auVar100 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar101 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar102 = vpbroadcastd_avx512f();
      auVar102 = vpsrlvd_avx512f(auVar102,auVar100);
      auVar102 = vpandd_avx512f(auVar102,auVar101);
      auVar105 = vpaddd_avx512f(auVar102,auVar105);
      uVar60 = uVar60 + 1;
    } while (len != uVar60);
    local_100[0] = vmovdqa64_avx512f(auVar105);
  }
  *(undefined8 *)flags = local_100[0]._0_8_;
  *(undefined8 *)(flags + 2) = local_100[0]._8_8_;
  *(undefined8 *)(flags + 4) = local_100[0]._16_8_;
  *(undefined8 *)(flags + 6) = local_100[0]._24_8_;
  *(undefined8 *)(flags + 8) = local_100[0]._32_8_;
  *(undefined8 *)(flags + 10) = local_100[0]._40_8_;
  *(undefined8 *)(flags + 0xc) = local_100[0]._48_8_;
  *(undefined8 *)(flags + 0xe) = local_100[0]._56_8_;
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_popcnt(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i masks[16];
    __m256i stubs[16];
    for (int i = 0; i < 16; ++i) {
        masks[i] = _mm256_set1_epi16(1 << i);
        stubs[i] = _mm256_set1_epi16(0);
    }

    uint32_t out_counters[16] = {0};

    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_cycles_updates = n_cycles / 16;

#define UPDATE(idx, shift) stubs[idx] = _mm256_or_si256(stubs[idx], _mm256_slli_epi16(_mm256_srli_epi16(_mm256_and_si256(_mm256_loadu_si256(data_vectors+pos), masks[idx]),  idx), shift));
#define ITERATION(idx) {                                           \
    UPDATE(0,idx);  UPDATE(1,idx);  UPDATE(2,idx);  UPDATE(3,idx); \
    UPDATE(4,idx);  UPDATE(5,idx);  UPDATE(6,idx);  UPDATE(7,idx); \
    UPDATE(8,idx);  UPDATE(9,idx);  UPDATE(10,idx); UPDATE(11,idx);\
    UPDATE(12,idx); UPDATE(13,idx); UPDATE(14,idx); UPDATE(15,idx);\
    ++pos;                                                         \
}
#define BLOCK {                                                \
    ITERATION(0);  ITERATION(1);  ITERATION(2);  ITERATION(3); \
    ITERATION(4);  ITERATION(5);  ITERATION(6);  ITERATION(7); \
    ITERATION(8);  ITERATION(9);  ITERATION(10); ITERATION(11);\
    ITERATION(12); ITERATION(13); ITERATION(14); ITERATION(15);\
}

    uint32_t pos = 0;
    for (size_t i = 0; i < n_cycles_updates; ++i) {
        BLOCK // unrolled
        
        // Not unrolled
        /*
        for (int c = 0; c < 16; ++c) { // 16 iterations per register
            ITERATION(c)
            // for (int j = 0; j < 16; ++j) { // each 1-hot per register
            //     UPDATE(j,c)
            // }
        }
        */

        for (int j = 0; j < 16; ++j) {
            PIL_POPCOUNT_AVX2(out_counters[j], stubs[j])
            stubs[j] = _mm256_set1_epi16(0);
        }
    }

    // residual
    for (size_t i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            out_counters[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    for (int i = 0; i < 16; ++i)
        flags[i] = out_counters[i];

#undef BLOCK
#undef ITERATION
#undef UPDATE

    return 0;
}